

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O0

Result_conflict * __thiscall
CoreML::NeuralNetworkSpecValidator::validateRandomUniformStaticLayer
          (Result_conflict *__return_storage_ptr__,NeuralNetworkSpecValidator *this,
          NeuralNetworkLayer *layer)

{
  bool bVar1;
  int iVar2;
  string *psVar3;
  float fVar4;
  float fVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  undefined1 local_118 [8];
  string err_1;
  string local_d0;
  RandomUniformStaticLayerParams *params;
  undefined1 local_70 [48];
  Result_conflict r;
  NeuralNetworkLayer *layer_local;
  NeuralNetworkSpecValidator *this_local;
  
  r._32_8_ = layer;
  Result::Result((Result *)(local_70 + 0x28));
  validateInputCount((Result_conflict *)local_70,(NeuralNetworkLayer *)r._32_8_,0,0);
  Result::operator=((Result *)(local_70 + 0x28),(Result *)local_70);
  Result::~Result((Result *)local_70);
  bVar1 = Result::good((Result *)(local_70 + 0x28));
  if (bVar1) {
    validateOutputCount((Result_conflict *)&params,(NeuralNetworkLayer *)r._32_8_,1,1);
    Result::operator=((Result *)(local_70 + 0x28),(Result *)&params);
    Result::~Result((Result *)&params);
  }
  local_d0._M_storage._M_storage =
       (uchar  [8])
       Specification::NeuralNetworkLayer::randomuniformstatic((NeuralNetworkLayer *)r._32_8_);
  iVar2 = Specification::RandomUniformStaticLayerParams::outputshape_size
                    ((RandomUniformStaticLayerParams *)local_d0._M_storage._M_storage);
  if (iVar2 == 0) {
    psVar3 = Specification::NeuralNetworkLayer::name_abi_cxx11_((NeuralNetworkLayer *)r._32_8_);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &err_1._M_storage,"Target shape is required parameter for \'",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar3);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &err_1._M_storage,"\' layer.");
    std::__cxx11::string::~string((string *)&err_1._M_storage);
    Result::Result((Result *)__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_d0);
    err_1.super__Rb_tree_node_base._M_right._4_4_ = 1;
    std::__cxx11::string::~string((string *)&local_d0);
  }
  else {
    fVar4 = Specification::RandomUniformStaticLayerParams::minval
                      ((RandomUniformStaticLayerParams *)local_d0._M_storage._M_storage);
    fVar5 = Specification::RandomUniformStaticLayerParams::maxval
                      ((RandomUniformStaticLayerParams *)local_d0._M_storage._M_storage);
    if (fVar4 <= fVar5) {
      Result::Result((Result *)__return_storage_ptr__,(Result *)(local_70 + 0x28));
      err_1.super__Rb_tree_node_base._M_right._4_4_ = 1;
    }
    else {
      psVar3 = Specification::NeuralNetworkLayer::name_abi_cxx11_((NeuralNetworkLayer *)r._32_8_);
      std::operator+(&local_138,"Value of minval should be smaller than maxval for \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar3);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118,
                     &local_138,"\' layer.");
      std::__cxx11::string::~string((string *)&local_138);
      Result::Result((Result *)__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_118);
      err_1.super__Rb_tree_node_base._M_right._4_4_ = 1;
      std::__cxx11::string::~string((string *)local_118);
    }
  }
  Result::~Result((Result *)(local_70 + 0x28));
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateRandomUniformStaticLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    r = validateInputCount(layer, 0, 0);
    if (r.good()) {
        r = validateOutputCount(layer, 1, 1);
    }
    const auto& params = layer.randomuniformstatic();
    if (params.outputshape_size() == 0) {
        const std::string err = "Target shape is required parameter for '" + layer.name() + "' layer.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    if (params.minval() > params.maxval()) {
        const std::string err = "Value of minval should be smaller than maxval for '" + layer.name() + "' layer.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    return r;
}